

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_multi_statemach(connectdata *conn,_Bool *done)

{
  imap_conn *imapc;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  if ((((conn->handler->flags & 1) == 0) || (((conn->proto).imapc.ssldone & 1U) != 0)) ||
     ((conn_local._4_4_ = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone),
      conn_local._4_4_ == CURLE_OK && (((conn->proto).imapc.ssldone & 1U) != 0)))) {
    conn_local._4_4_ = Curl_pp_statemach(&(conn->proto).ftpc.pp,false,false);
    *done = (conn->proto).imapc.state == IMAP_STOP;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_multi_statemach(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  if((conn->handler->flags & PROTOPT_SSL) && !imapc->ssldone) {
    result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &imapc->ssldone);
    if(result || !imapc->ssldone)
      return result;
  }

  result = Curl_pp_statemach(&imapc->pp, FALSE, FALSE);
  *done = (imapc->state == IMAP_STOP) ? TRUE : FALSE;

  return result;
}